

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_debugger_type_&,_const_type_safe::object_ref<const_debugger_type,_false>_&> *
__thiscall
Catch::ExprLhs<debugger_type_const&>::operator!=
          (BinaryExpr<const_debugger_type_&,_const_type_safe::object_ref<const_debugger_type,_false>_&>
           *__return_storage_ptr__,ExprLhs<debugger_type_const&> *this,
          object_ref<const_debugger_type,_false> *rhs)

{
  debugger_type *pdVar1;
  debugger_type *pdVar2;
  StringRef local_38;
  
  pdVar1 = *(debugger_type **)this;
  pdVar2 = rhs->ptr_;
  StringRef::StringRef(&local_38,"!=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = pdVar2 != pdVar1;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021e190;
  __return_storage_ptr__->m_lhs = pdVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }